

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_util.c
# Opt level: O2

size_t bitset_extract_setbits_avx2
                 (uint64_t *words,size_t length,uint32_t *out,size_t outcapacity,uint32_t base)

{
  undefined1 (*pauVar1) [32];
  byte bVar2;
  byte bVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  int iVar6;
  int iVar7;
  undefined1 (*pauVar8) [32];
  byte bVar10;
  ulong uVar9;
  uint64_t uVar11;
  ulong uVar12;
  bool bVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [64];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  
  iVar7 = base - 1;
  auVar15 = ZEXT3264(CONCAT428(iVar7,CONCAT424(iVar7,CONCAT420(iVar7,CONCAT416(iVar7,CONCAT412(iVar7
                                                  ,CONCAT48(iVar7,CONCAT44(iVar7,iVar7))))))));
  pauVar1 = (undefined1 (*) [32])(out + outcapacity);
  uVar12 = 0;
  auVar16._8_4_ = 0x40;
  auVar16._0_8_ = 0x4000000040;
  auVar16._12_4_ = 0x40;
  auVar16._16_4_ = 0x40;
  auVar16._20_4_ = 0x40;
  auVar16._24_4_ = 0x40;
  auVar16._28_4_ = 0x40;
  auVar17._8_4_ = 8;
  auVar17._0_8_ = 0x800000008;
  auVar17._12_4_ = 8;
  auVar17._16_4_ = 8;
  auVar17._20_4_ = 8;
  auVar17._24_4_ = 8;
  auVar17._28_4_ = 8;
  auVar18._8_4_ = 0x10;
  auVar18._0_8_ = 0x1000000010;
  auVar18._12_4_ = 0x10;
  auVar18._16_4_ = 0x10;
  auVar18._20_4_ = 0x10;
  auVar18._24_4_ = 0x10;
  auVar18._28_4_ = 0x10;
  pauVar8 = (undefined1 (*) [32])out;
  while ((uVar12 < length && (pauVar8 + 8 <= pauVar1))) {
    uVar9 = words[uVar12];
    if (uVar9 == 0) {
      auVar4 = vpaddd_avx2(auVar15._0_32_,auVar16);
      auVar15 = ZEXT3264(auVar4);
    }
    else {
      iVar7 = 4;
      while (bVar13 = iVar7 != 0, iVar7 = iVar7 + -1, bVar13) {
        bVar10 = (byte)(uVar9 >> 8);
        bVar2 = ""[uVar9 & 0xff];
        bVar3 = ""[bVar10];
        auVar14 = auVar15._0_32_;
        auVar4 = vpaddd_avx2(auVar14,*(undefined1 (*) [32])
                                      ((long)vecDecodeTable[0] +
                                      (ulong)(uint)((int)(uVar9 & 0xff) << 5)));
        auVar5 = vpaddd_avx2(auVar14,(undefined1  [32])vecDecodeTable[bVar10]);
        uVar9 = uVar9 >> 0x10;
        auVar5 = vpaddd_avx2(auVar5,auVar17);
        auVar14 = vpaddd_avx2(auVar14,auVar18);
        auVar15 = ZEXT3264(auVar14);
        *pauVar8 = auVar4;
        *(undefined1 (*) [32])(*pauVar8 + (ulong)bVar2 * 4) = auVar5;
        pauVar8 = (undefined1 (*) [32])
                  (*(undefined1 (*) [32])(*pauVar8 + (ulong)bVar2 * 4) + (ulong)bVar3 * 4);
      }
    }
    uVar12 = uVar12 + 1;
  }
  iVar7 = (int)uVar12 * 0x40 + base;
  while ((uVar12 < length && (pauVar8 < pauVar1))) {
    uVar11 = words[uVar12];
    for (; (uVar11 != 0 && (pauVar8 < pauVar1)); pauVar8 = (undefined1 (*) [32])(*pauVar8 + 4)) {
      iVar6 = 0;
      for (uVar9 = uVar11; (uVar9 & 1) == 0; uVar9 = uVar9 >> 1 | 0x8000000000000000) {
        iVar6 = iVar6 + 1;
      }
      *(int *)*pauVar8 = iVar6 + iVar7;
      uVar11 = uVar11 - 1 & uVar11;
    }
    iVar7 = iVar7 + 0x40;
    uVar12 = uVar12 + 1;
  }
  return (long)pauVar8 - (long)out >> 2;
}

Assistant:

CROARING_TARGET_AVX2
size_t bitset_extract_setbits_avx2(const uint64_t *words, size_t length,
                                   uint32_t *out, size_t outcapacity,
                                   uint32_t base) {
    uint32_t *initout = out;
    __m256i baseVec = _mm256_set1_epi32(base - 1);
    __m256i incVec = _mm256_set1_epi32(64);
    __m256i add8 = _mm256_set1_epi32(8);
    uint32_t *safeout = out + outcapacity;
    size_t i = 0;
    for (; (i < length) && (out + 64 <= safeout); ++i) {
        uint64_t w = words[i];
        if (w == 0) {
            baseVec = _mm256_add_epi32(baseVec, incVec);
        } else {
            for (int k = 0; k < 4; ++k) {
                uint8_t byteA = (uint8_t)w;
                uint8_t byteB = (uint8_t)(w >> 8);
                w >>= 16;
                __m256i vecA =
                    _mm256_loadu_si256((const __m256i *)vecDecodeTable[byteA]);
                __m256i vecB =
                    _mm256_loadu_si256((const __m256i *)vecDecodeTable[byteB]);
                uint8_t advanceA = lengthTable[byteA];
                uint8_t advanceB = lengthTable[byteB];
                vecA = _mm256_add_epi32(baseVec, vecA);
                baseVec = _mm256_add_epi32(baseVec, add8);
                vecB = _mm256_add_epi32(baseVec, vecB);
                baseVec = _mm256_add_epi32(baseVec, add8);
                _mm256_storeu_si256((__m256i *)out, vecA);
                out += advanceA;
                _mm256_storeu_si256((__m256i *)out, vecB);
                out += advanceB;
            }
        }
    }
    base += i * 64;
    for (; (i < length) && (out < safeout); ++i) {
        uint64_t w = words[i];
        while ((w != 0) && (out < safeout)) {
            int r =
                roaring_trailing_zeroes(w);  // on x64, should compile to TZCNT
            uint32_t val = r + base;
            memcpy(out, &val,
                   sizeof(uint32_t));  // should be compiled as a MOV on x64
            out++;
            w &= (w - 1);
        }
        base += 64;
    }
    return out - initout;
}